

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h263d_parser.c
# Opt level: O3

MPP_RET mpp_h263_parser_reset(H263dParser ctx)

{
  MppBufSlots slots;
  int index;
  
  slots = *ctx;
  index = *(int *)((long)ctx + 0x88);
  if (((byte)h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"in\n","mpp_h263_parser_reset");
  }
  if ((-1 < index) || (index = *(int *)((long)ctx + 0x88), -1 < index)) {
    mpp_buf_slot_clr_flag(slots,index,SLOT_CODEC_USE);
    *(undefined4 *)((long)ctx + 0x88) = 0xffffffff;
  }
  *(undefined4 *)((long)ctx + 0xc) = 0;
  if (((byte)h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"out\n","mpp_h263_parser_reset");
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_h263_parser_reset(H263dParser ctx)
{
    H263dParserImpl *p = (H263dParserImpl *)ctx;
    MppBufSlots slots = p->frame_slots;
    H263Hdr *hdr_curr = &p->hdr_ref0;
    H263Hdr *hdr_ref0 = &p->hdr_ref0;
    RK_S32 index = hdr_curr->slot_idx;

    h263d_dbg_func("in\n");

    if (index >= 0) {
        mpp_buf_slot_clr_flag(slots, index, SLOT_CODEC_USE);
        hdr_curr->slot_idx = -1;
    }

    index = hdr_ref0->slot_idx;
    if (index >= 0) {
        mpp_buf_slot_clr_flag(slots, index, SLOT_CODEC_USE);
        hdr_ref0->slot_idx = -1;
    }

    p->found_i_vop = 0;

    h263d_dbg_func("out\n");

    return MPP_OK;
}